

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O0

bool __thiscall
dlib::mfp_kernel_1_base_class<2UL>::
mp_impl_T<dlib::mfp_kernel_1_base_class<2UL>::mp_null<dlib::mfp_kernel_1_base_class<2UL>::dummy>_>::
is_same(mp_impl_T<dlib::mfp_kernel_1_base_class<2UL>::mp_null<dlib::mfp_kernel_1_base_class<2UL>::dummy>_>
        *this,mp_base_base *item)

{
  mp_null<dlib::mfp_kernel_1_base_class<2UL>::dummy> *i;
  mp_base_base *item_local;
  mp_impl_T<dlib::mfp_kernel_1_base_class<2UL>::mp_null<dlib::mfp_kernel_1_base_class<2UL>::dummy>_>
  *this_local;
  bool local_1;
  
  if ((item->o == (void *)0x0) &&
     ((this->super_mp_null<dlib::mfp_kernel_1_base_class<2UL>::dummy>).super_mp_base_base.o ==
      (void *)0x0)) {
    local_1 = true;
  }
  else if ((item->o ==
            (this->super_mp_null<dlib::mfp_kernel_1_base_class<2UL>::dummy>).super_mp_base_base.o)
          && ((this->super_mp_null<dlib::mfp_kernel_1_base_class<2UL>::dummy>).super_mp_base_base.
              type == item->type)) {
    local_1 = item[1]._vptr_mp_base_base ==
              (_func_int **)
              (this->super_mp_null<dlib::mfp_kernel_1_base_class<2UL>::dummy>).callback &&
              (item[1]._vptr_mp_base_base == (_func_int **)0x0 ||
              item[1].o ==
              *(void **)&(this->super_mp_null<dlib::mfp_kernel_1_base_class<2UL>::dummy>).field_0x20
              );
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_same (const mp_base_base* item) const 
            {
                if (item->o == 0 && this->o == 0)
                {
                    return true;
                }
                else if (item->o == this->o && this->type == item->type)
                {
                    const mp_impl* i = reinterpret_cast<const mp_impl*>(item);
                    return (i->callback == this->callback);
                }
                return false;
            }